

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall higan::LogFile::RollFile(LogFile *this)

{
  undefined8 __p;
  bool bVar1;
  undefined1 local_40 [8];
  string file_name;
  
  bVar1 = System::MakeDirIfNotExist(&this->log_dir_,true);
  if (!bVar1) {
    fwrite("create log dir failed\n",0x16,1,_stderr);
  }
  GetFileName_abi_cxx11_((string *)local_40,this);
  std::make_unique<higan::FileForAppend,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&file_name.field_2 + 8));
  __p = file_name.field_2._8_8_;
  file_name.field_2._8_8_ = 0;
  std::__uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::reset
            ((__uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> *)
             &this->file_ptr_,(pointer)__p);
  std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::~unique_ptr
            ((unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> *)
             ((long)&file_name.field_2 + 8));
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void LogFile::RollFile()
{
	bool result = System::MakeDirIfNotExist(log_dir_, true);
	if (!result)
	{
		fprintf(stderr, "create log dir failed\n");
	}

	std::string file_name = GetFileName();
	file_ptr_ = std::make_unique<FileForAppend>(file_name);
}